

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O2

ICommandQueueVk * __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::LockCommandQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                   *this,SoftwareQueueIndex QueueInd)

{
  CommandQueue *pCVar1;
  char (*in_RCX) [27];
  ulong uVar2;
  string msg;
  string local_38;
  
  uVar2 = (ulong)QueueInd.m_Value;
  if (this->m_CmdQueueCount <= uVar2) {
    FormatString<char[26],char[27]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x5b55cc,in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"LockCommandQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x10f);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pCVar1 = this->m_CommandQueues;
  std::mutex::lock(&pCVar1[uVar2].Mtx);
  return pCVar1[uVar2].CmdQueue.m_pObject;
}

Assistant:

CommandQueueType* LockCommandQueue(SoftwareQueueIndex QueueInd)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        auto& Queue = m_CommandQueues[QueueInd];
        Queue.Mtx.lock();
        return Queue.CmdQueue;
    }